

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

nghttp2_ssize
nghttp2_session_mem_send_internal(nghttp2_session *session,uint8_t **data_ptr,int fast_cb)

{
  nghttp2_mem *mem;
  nghttp2_bufs *bufs;
  nghttp2_hd_deflater *deflater;
  uint uVar1;
  nghttp2_outbound_item *pnVar2;
  nghttp2_before_frame_send_callback p_Var3;
  nghttp2_on_frame_not_send_callback p_Var4;
  uint8_t *puVar5;
  uint8_t uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  nghttp2_frame *pnVar11;
  nghttp2_stream *pnVar12;
  size_t sVar13;
  nghttp2_pack_extension_callback2 p_Var14;
  ulong uVar15;
  long lVar16;
  nghttp2_buf_chain *pnVar17;
  uint32_t uVar18;
  nghttp2_frame *frame;
  ulong uVar19;
  int32_t iVar20;
  uint8_t *puVar21;
  
  uVar7 = nghttp2_session_adjust_idle_stream(session);
  if ((int)uVar7 < -900) {
LAB_0010b881:
    return (long)(int)uVar7;
  }
  mem = &session->mem;
  bufs = &(session->aob).framebufs;
  deflater = &session->hd_deflater;
switchD_0010ad04_default:
  do {
    switch((session->aob).state) {
    case NGHTTP2_OB_POP_ITEM:
      pnVar11 = &nghttp2_session_pop_next_ob_item(session)->frame;
      if (pnVar11 == (nghttp2_frame *)0x0) {
        return 0;
      }
      uVar6 = (pnVar11->hd).type;
      switch(uVar6) {
      case '\0':
        pnVar12 = nghttp2_session_get_stream(session,(pnVar11->hd).stream_id);
        if ((pnVar12 != (nghttp2_stream *)0x0) && (&pnVar12->item->frame != pnVar11)) {
          __assert_fail("stream->item == item",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                        ,0x923,"int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)")
          ;
        }
        uVar10 = nghttp2_session_predicate_data_send(session,pnVar12);
        if (uVar10 == 0) {
          if (pnVar12 == (nghttp2_stream *)0x0) {
            __assert_fail("stream",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                          ,0x933,
                          "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
          }
          uVar7 = session->remote_window_size;
          uVar10 = pnVar12->remote_window_size;
          if ((int)uVar7 <= pnVar12->remote_window_size) {
            uVar10 = uVar7;
          }
          uVar1 = (session->remote_settings).max_frame_size;
          if ((int)uVar1 <= (int)uVar10) {
            uVar10 = uVar1;
          }
          if ((int)uVar10 < 1) {
            if ((int)uVar7 < 1) {
              __assert_fail("session->remote_window_size > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                            ,0x939,
                            "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
            }
            uVar6 = '\x04';
          }
          else {
            if (0x3fff < uVar10) {
              uVar10 = 0x4000;
            }
            uVar10 = nghttp2_session_pack_data
                               (session,bufs,(ulong)uVar10,pnVar11,
                                (nghttp2_data_aux_data *)((long)pnVar11 + 0x60),pnVar12);
            if (uVar10 == 0xfffffdf7) {
              session_detach_stream_item(session,pnVar12);
              uVar10 = nghttp2_session_add_rst_stream(session,(pnVar11->hd).stream_id,2);
              uVar7 = 0xfffffdf7;
              if (-0x385 < (int)uVar10) break;
              goto LAB_0010b635;
            }
            if (uVar10 != 0xfffffe04) {
              if (uVar10 == 0) goto LAB_0010b658;
              if (uVar10 == 0xfffffdf2) {
                return 0;
              }
              goto LAB_0010ad88;
            }
            uVar6 = '\b';
          }
          session_defer_stream_item(session,pnVar12,uVar6);
          (session->aob).item = (nghttp2_outbound_item *)0x0;
          goto LAB_0010ae3a;
        }
        pnVar12 = (nghttp2_stream *)nghttp2_map_find(&session->streams,(pnVar11->hd).stream_id);
        if (pnVar12 != (nghttp2_stream *)0x0) {
LAB_0010ad88:
          session_detach_stream_item(session,pnVar12);
        }
        goto LAB_0010b635;
      case '\x01':
        if ((pnVar11->headers).cat == NGHTTP2_HCAT_REQUEST) {
          pnVar12 = nghttp2_session_open_stream
                              (session,(pnVar11->hd).stream_id,'\0',&(pnVar11->headers).pri_spec,
                               NGHTTP2_STREAM_INITIAL,*(void **)((long)pnVar11 + 0x78));
          if (pnVar12 == (nghttp2_stream *)0x0) {
            uVar7 = 0xfffffc7b;
          }
          else {
            uVar7 = 0xfffffe01;
            if (((*(char *)((long)pnVar11 + 0x84) == '\0') &&
                (uVar7 = 0xfffffdfc, (session->goaway_flags & 8) == 0)) &&
               (iVar8 = session_is_closing(session), iVar8 == 0)) {
              if ((session->opt_flags & 4) == 0) {
                nghttp2_http_record_request_method(pnVar12,pnVar11);
              }
              goto LAB_0010b53e;
            }
          }
        }
        else {
          pnVar12 = nghttp2_session_get_stream(session,(pnVar11->hd).stream_id);
          if ((pnVar12 == (nghttp2_stream *)0x0) || (pnVar12->state != NGHTTP2_STREAM_RESERVED)) {
            iVar8 = session_predicate_for_stream_send(session,pnVar12);
            if (iVar8 == 0) {
              if (pnVar12 == (nghttp2_stream *)0x0) {
                __assert_fail("stream",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                              ,0x74a,
                              "int session_predicate_response_headers_send(nghttp2_session *, nghttp2_stream *)"
                             );
              }
              if (((session->server != '\0') &&
                  (pnVar12->stream_id == 0 || (pnVar12->stream_id & 1U) != 0)) &&
                 (pnVar12->state == NGHTTP2_STREAM_OPENING)) {
                (pnVar11->headers).cat = NGHTTP2_HCAT_RESPONSE;
                goto LAB_0010b53e;
              }
            }
            (pnVar11->headers).cat = NGHTTP2_HCAT_HEADERS;
            uVar10 = session_predicate_for_stream_send(session,pnVar12);
            if (uVar10 != 0) goto LAB_0010b635;
            if (pnVar12 == (nghttp2_stream *)0x0) {
              __assert_fail("stream",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                            ,0x7a4,
                            "int session_predicate_headers_send(nghttp2_session *, nghttp2_stream *)"
                           );
            }
            if (pnVar12->state == NGHTTP2_STREAM_OPENED) {
LAB_0010b53e:
              sVar13 = nghttp2_hd_deflate_bound
                                 (deflater,(pnVar11->headers).nva,(pnVar11->headers).nvlen);
              uVar7 = 0xfffffdf6;
              if (sVar13 + 5 <= session->max_send_header_block_length) {
                uVar10 = nghttp2_frame_pack_headers(bufs,&pnVar11->headers,deflater);
                if ((uVar10 == 0) &&
                   (uVar10 = session_headers_add_pad(session,pnVar11), uVar10 == 0)) {
                  if ((pnVar11->headers).cat == NGHTTP2_HCAT_REQUEST) {
                    iVar8 = (pnVar11->hd).stream_id;
                    if (iVar8 <= session->last_sent_stream_id) {
                      __assert_fail("session->last_sent_stream_id < frame->hd.stream_id",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                                    ,0x9b9,
                                    "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)"
                                   );
                    }
                    goto LAB_0010b5ae;
                  }
                  goto LAB_0010b658;
                }
                goto LAB_0010b635;
              }
            }
            else {
              uVar7 = 0xfffffe01;
              if (pnVar12->state != NGHTTP2_STREAM_CLOSING) {
                uVar7 = 0xfffffdfe;
                if ((pnVar12->stream_id != 0) &&
                   (((session->server == '\0' ^ (byte)pnVar12->stream_id) & 1) == 0))
                goto LAB_0010b53e;
              }
            }
          }
          else {
            uVar10 = session_predicate_for_stream_send(session,pnVar12);
            if (uVar10 != 0) goto LAB_0010b635;
            uVar7 = 0xfffffe07;
            if (((session->server != '\0') && (pnVar12->state == NGHTTP2_STREAM_RESERVED)) &&
               (uVar7 = 0xfffffdfc, (session->goaway_flags & 8) == 0)) {
              (pnVar11->headers).cat = NGHTTP2_HCAT_PUSH_RESPONSE;
              if (*(void **)((long)pnVar11 + 0x78) != (void *)0x0) {
                pnVar12->stream_user_data = *(void **)((long)pnVar11 + 0x78);
              }
              goto LAB_0010b53e;
            }
          }
        }
        break;
      case '\x02':
        iVar8 = session_is_closing(session);
        uVar7 = 0xfffffdee;
        if (iVar8 != 0) break;
        nghttp2_frame_pack_priority(bufs,&pnVar11->priority);
        goto LAB_0010b658;
      case '\x03':
        iVar8 = session_is_closing(session);
        uVar7 = 0xfffffdee;
        if (iVar8 == 0) {
          nghttp2_frame_pack_rst_stream(bufs,&pnVar11->rst_stream);
          goto LAB_0010b658;
        }
        break;
      case '\x04':
        if (((pnVar11->hd).flags & 1) != 0) {
          if (session->obq_flood_counter_ == 0) {
            __assert_fail("session->obq_flood_counter_ > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                          ,0x9d5,
                          "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
          }
          session->obq_flood_counter_ = session->obq_flood_counter_ - 1;
          iVar8 = session_is_closing(session);
          uVar7 = 0xfffffdee;
          if (iVar8 != 0) break;
        }
        uVar10 = nghttp2_frame_pack_settings(bufs,&pnVar11->settings);
        goto LAB_0010b635;
      case '\x05':
        pnVar12 = nghttp2_session_get_stream(session,(pnVar11->hd).stream_id);
        if (session->server == '\0') {
          uVar7 = 0xfffffe07;
        }
        else {
          uVar10 = session_predicate_for_stream_send(session,pnVar12);
          if (uVar10 != 0) goto LAB_0010b635;
          if (pnVar12 == (nghttp2_stream *)0x0) {
            __assert_fail("stream",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                          ,0x7d9,
                          "int session_predicate_push_promise_send(nghttp2_session *, nghttp2_stream *)"
                         );
          }
          if ((session->remote_settings).enable_push == 0) {
            uVar7 = 0xfffffdf0;
          }
          else {
            uVar7 = 0xfffffe01;
            if ((pnVar12->state != NGHTTP2_STREAM_CLOSING) &&
               (uVar7 = 0xfffffdfc, (session->goaway_flags & 8) == 0)) {
              sVar13 = nghttp2_hd_deflate_bound
                                 (deflater,(pnVar11->push_promise).nva,(pnVar11->push_promise).nvlen
                                 );
              uVar7 = 0xfffffdf6;
              if (sVar13 <= session->max_send_header_block_length) {
                uVar10 = nghttp2_frame_pack_push_promise(bufs,&pnVar11->push_promise,deflater);
                if ((uVar10 != 0) ||
                   (uVar10 = session_headers_add_pad(session,pnVar11), uVar10 != 0))
                goto LAB_0010b635;
                iVar8 = (pnVar11->push_promise).promised_stream_id;
                if (iVar8 < session->last_sent_stream_id + 2) {
                  __assert_fail("session->last_sent_stream_id + 2 <= frame->push_promise.promised_stream_id"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                                ,0xa08,
                                "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)"
                               );
                }
LAB_0010b5ae:
                session->last_sent_stream_id = iVar8;
                goto LAB_0010b658;
              }
            }
          }
        }
        break;
      case '\x06':
        if (((pnVar11->hd).flags & 1) != 0) {
          if (session->obq_flood_counter_ == 0) {
            __assert_fail("session->obq_flood_counter_ > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                          ,0xa0f,
                          "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
          }
          session->obq_flood_counter_ = session->obq_flood_counter_ - 1;
        }
        uVar7 = 0xfffffdee;
        if ((session->goaway_flags & 1) == 0) {
          nghttp2_frame_pack_ping(bufs,&pnVar11->ping);
          goto LAB_0010b658;
        }
        break;
      case '\a':
        uVar10 = nghttp2_frame_pack_goaway(bufs,&pnVar11->goaway);
        if (uVar10 == 0) {
          session->local_last_stream_id = (pnVar11->priority).pri_spec.stream_id;
          goto LAB_0010b658;
        }
LAB_0010b635:
        if (uVar10 == 0xfffffe04) goto switchD_0010ad04_default;
        if (uVar10 == 0xfffffdf2) {
          return 0;
        }
        uVar7 = uVar10;
        if (-1 < (int)uVar10) {
LAB_0010b658:
          (session->aob).item = (nghttp2_outbound_item *)pnVar11;
          (session->aob).framebufs.cur = (session->aob).framebufs.head;
          if ((pnVar11->hd).type == '\0') {
            if (*(char *)((long)pnVar11 + 0x7a) != '\0') {
              (session->aob).state = NGHTTP2_OB_SEND_NO_COPY;
              goto switchD_0010ad04_default;
            }
          }
          else {
            p_Var3 = (session->callbacks).before_frame_send_callback;
            if ((p_Var3 != (nghttp2_before_frame_send_callback)0x0) &&
               (iVar8 = (*p_Var3)(session,pnVar11,session->user_data), iVar8 != 0)) {
              if (iVar8 != -0x217) {
                return -0x386;
              }
              p_Var4 = (session->callbacks).on_frame_not_send_callback;
              if ((p_Var4 != (nghttp2_on_frame_not_send_callback)0x0) &&
                 (iVar8 = (*p_Var4)(session,pnVar11,-0x217,session->user_data), iVar8 != 0)) {
                return -0x386;
              }
              lVar16 = 0x28;
              uVar18 = 2;
              if ((pnVar11->hd).type == '\x05') {
LAB_0010b700:
                if (*(int32_t *)((long)pnVar11 + lVar16) != 0) {
                  uVar7 = nghttp2_session_close_stream
                                    (session,*(int32_t *)((long)pnVar11 + lVar16),uVar18);
LAB_0010ae9f:
                  if ((int)uVar7 < -900) goto LAB_0010b881;
                }
              }
              else if ((pnVar11->hd).type == '\x01') {
                lVar16 = 8;
                uVar18 = 7;
                if ((pnVar11->headers).cat == NGHTTP2_HCAT_REQUEST) goto LAB_0010b700;
              }
LAB_0010ae3a:
              active_outbound_item_reset(&session->aob,mem);
              goto switchD_0010ad04_default;
            }
          }
          (session->aob).state = NGHTTP2_OB_SEND_DATA;
          goto switchD_0010ad04_default;
        }
        break;
      case '\b':
        iVar8 = (pnVar11->hd).stream_id;
        iVar9 = session_is_closing(session);
        uVar7 = 0xfffffdee;
        if (iVar9 == 0) {
          if (iVar8 == 0) {
LAB_0010b186:
            nghttp2_frame_pack_window_update(bufs,&pnVar11->window_update);
            goto LAB_0010b658;
          }
          pnVar12 = nghttp2_session_get_stream(session,iVar8);
          if (pnVar12 == (nghttp2_stream *)0x0) {
LAB_0010b5d7:
            uVar7 = 0xfffffe02;
          }
          else if (pnVar12->state == NGHTTP2_STREAM_CLOSING) {
            uVar7 = 0xfffffe01;
          }
          else if (((pnVar12->state != NGHTTP2_STREAM_RESERVED) || (pnVar12->stream_id == 0)) ||
                  (uVar7 = 0xfffffdfe,
                  ((session->server == '\0' ^ (byte)pnVar12->stream_id) & 1) != 0))
          goto LAB_0010b186;
        }
        break;
      case '\t':
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                      ,0xa2b,"int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
      default:
        if (*(char *)((long)pnVar11 + 0x60) == '\0') {
          iVar8 = session_is_closing(session);
          uVar7 = 0xfffffdee;
          if (iVar8 == 0) {
            p_Var14 = (session->callbacks).pack_extension_callback2;
            if ((p_Var14 == (nghttp2_pack_extension_callback2)0x0) &&
               ((session->callbacks).pack_extension_callback == (nghttp2_pack_extension_callback)0x0
               )) {
              __assert_fail("session->callbacks.pack_extension_callback2 || session->callbacks.pack_extension_callback"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                            ,0x8eb,
                            "int session_pack_extension(nghttp2_session *, nghttp2_bufs *, nghttp2_frame *)"
                           );
            }
            pnVar17 = bufs->head;
            puVar21 = (pnVar17->buf).last;
            uVar19 = (long)(pnVar17->buf).end - (long)puVar21;
            if (0x3fff < uVar19) {
              uVar19 = 0x4000;
            }
            if (p_Var14 == (nghttp2_pack_extension_callback2)0x0) {
              p_Var14 = (nghttp2_pack_extension_callback2)
                        (session->callbacks).pack_extension_callback;
            }
            uVar15 = (*p_Var14)(session,puVar21,uVar19,pnVar11,session->user_data);
            uVar7 = 0xfffffde9;
            if ((uVar15 != 0xfffffffffffffde9) && (uVar7 = 0xfffffc7a, uVar15 <= uVar19)) {
              (pnVar11->hd).length = uVar15;
              puVar21 = (pnVar17->buf).pos;
              puVar5 = (pnVar17->buf).last;
              if (puVar21 != puVar5) {
                __assert_fail("buf->pos == buf->last",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                              ,0x903,
                              "int session_pack_extension(nghttp2_session *, nghttp2_bufs *, nghttp2_frame *)"
                             );
              }
              (pnVar17->buf).last = puVar5 + uVar15;
              puVar21 = puVar21 + -9;
              (pnVar17->buf).pos = puVar21;
              nghttp2_frame_pack_frame_hd(puVar21,&pnVar11->hd);
              goto LAB_0010b658;
            }
          }
        }
        else if (uVar6 == '\x10') {
          iVar20 = *(pnVar11->ext).payload;
          iVar8 = session_is_closing(session);
          uVar7 = 0xfffffdee;
          if ((iVar8 == 0) &&
             ((pnVar12 = nghttp2_session_get_stream(session,iVar20),
              pnVar12 == (nghttp2_stream *)0x0 ||
              ((uVar7 = 0xfffffe01, pnVar12->state != NGHTTP2_STREAM_CLOSING &&
               (uVar7 = 0xfffffdfe, (pnVar12->shut_flags & 1) == 0)))))) {
            nghttp2_frame_pack_priority_update(bufs,&pnVar11->ext);
            goto LAB_0010b658;
          }
        }
        else if (uVar6 == '\f') {
          iVar8 = session_is_closing(session);
          uVar7 = 0xfffffdee;
          if (iVar8 == 0) {
            uVar10 = nghttp2_frame_pack_origin(bufs,&pnVar11->ext);
            goto LAB_0010b635;
          }
        }
        else {
          if (uVar6 != '\n') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                          ,0xa60,
                          "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
          }
          iVar8 = (pnVar11->hd).stream_id;
          iVar9 = session_is_closing(session);
          uVar7 = 0xfffffdee;
          if (iVar9 == 0) {
            if (iVar8 != 0) {
              pnVar12 = nghttp2_session_get_stream(session,iVar8);
              if (pnVar12 == (nghttp2_stream *)0x0) goto LAB_0010b5d7;
              uVar7 = 0xfffffe01;
              if (pnVar12->state == NGHTTP2_STREAM_CLOSING) break;
            }
            nghttp2_frame_pack_altsvc(bufs,&pnVar11->ext);
            goto LAB_0010b658;
          }
        }
      }
      uVar6 = (pnVar11->hd).type;
      iVar8 = 0;
      if (uVar6 != '\0') {
        p_Var4 = (session->callbacks).on_frame_not_send_callback;
        if ((p_Var4 != (nghttp2_on_frame_not_send_callback)0x0) &&
           (uVar6 != '\b' && 0xfffffc7c < uVar7)) {
          iVar9 = (*p_Var4)(session,pnVar11,uVar7,session->user_data);
          if (iVar9 != 0) {
            nghttp2_outbound_item_free((nghttp2_outbound_item *)&pnVar11->hd,mem);
            nghttp2_mem_free(mem,pnVar11);
            return -0x386;
          }
          uVar6 = (pnVar11->hd).type;
        }
        if (uVar6 == '\x05') {
          iVar20 = (pnVar11->push_promise).promised_stream_id;
          uVar18 = 2;
        }
        else {
          if ((uVar6 != '\x01') || ((pnVar11->headers).cat != NGHTTP2_HCAT_REQUEST))
          goto LAB_0010b7c4;
          iVar20 = (pnVar11->hd).stream_id;
          if (*(char *)((long)pnVar11 + 0x84) == '\0') {
            uVar18 = 7;
          }
          else {
            uVar18 = *(uint32_t *)(pnVar11 + 2);
          }
        }
        iVar8 = 0;
        if (iVar20 != 0) {
          iVar8 = nghttp2_session_close_stream(session,iVar20,uVar18);
        }
      }
LAB_0010b7c4:
      nghttp2_outbound_item_free((nghttp2_outbound_item *)&pnVar11->hd,mem);
      nghttp2_mem_free(mem,pnVar11);
      active_outbound_item_reset(&session->aob,mem);
      if (iVar8 < -900) {
        return (long)iVar8;
      }
      if (uVar7 == 0xfffffdf5) {
        uVar7 = nghttp2_session_terminate_session(session,2);
      }
      if ((int)uVar7 < -900) {
        return (long)(int)uVar7;
      }
      break;
    case NGHTTP2_OB_SEND_DATA:
      pnVar17 = (session->aob).framebufs.cur;
      puVar21 = (pnVar17->buf).pos;
      if (puVar21 != (pnVar17->buf).last) {
LAB_0010b819:
        *data_ptr = puVar21;
        puVar21 = (pnVar17->buf).last;
        puVar5 = (pnVar17->buf).pos;
        (pnVar17->buf).pos = puVar21;
        return (long)puVar21 - (long)puVar5;
      }
      if ((fast_cb == 0) && (uVar7 = session_after_frame_sent1(session), (int)uVar7 < 0)) {
        if (0xfffffc7b < uVar7) {
          __assert_fail("nghttp2_is_fatal(rv)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                        ,0xd69,
                        "nghttp2_ssize nghttp2_session_mem_send_internal(nghttp2_session *, const uint8_t **, int)"
                       );
        }
        goto LAB_0010b881;
      }
      session_after_frame_sent2(session);
      break;
    case NGHTTP2_OB_SEND_NO_COPY:
      pnVar2 = (session->aob).item;
      pnVar12 = nghttp2_session_get_stream(session,(pnVar2->frame).hd.stream_id);
      if (pnVar12 == (nghttp2_stream *)0x0) goto LAB_0010ae3a;
      pnVar11 = &((session->aob).item)->frame;
      iVar8 = (*(session->callbacks).send_data_callback)
                        (session,pnVar11,(((session->aob).framebufs.cur)->buf).pos,
                         (pnVar11->hd).length - (pnVar11->data).padlen,
                         (nghttp2_data_source *)((long)pnVar11 + 0x68),session->user_data);
      if (iVar8 != -0x20e) {
        if (iVar8 != -0x209) {
          if (iVar8 != 0) {
            if (iVar8 == -0x1f8) {
              return 0;
            }
            return -0x386;
          }
          goto LAB_0010adfc;
        }
        session_detach_stream_item(session,pnVar12);
        uVar7 = nghttp2_session_add_rst_stream(session,(pnVar2->frame).hd.stream_id,2);
        goto LAB_0010ae9f;
      }
LAB_0010adfc:
      uVar7 = session_after_frame_sent1(session);
      if (-1 < (int)uVar7) goto code_r0x0010ae0c;
      if (0xfffffc7b < uVar7) {
        __assert_fail("nghttp2_is_fatal(rv)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                      ,0xda8,
                      "nghttp2_ssize nghttp2_session_mem_send_internal(nghttp2_session *, const uint8_t **, int)"
                     );
      }
      goto LAB_0010b881;
    case NGHTTP2_OB_SEND_CLIENT_MAGIC:
      pnVar17 = (session->aob).framebufs.cur;
      puVar21 = (pnVar17->buf).pos;
      if (puVar21 != (pnVar17->buf).last) goto LAB_0010b819;
      goto LAB_0010ae3a;
    }
  } while( true );
code_r0x0010ae0c:
  session_after_frame_sent2(session);
  if (iVar8 == -0x20e) {
    return 0;
  }
  goto switchD_0010ad04_default;
}

Assistant:

static nghttp2_ssize nghttp2_session_mem_send_internal(nghttp2_session *session,
                                                       const uint8_t **data_ptr,
                                                       int fast_cb) {
  int rv;
  nghttp2_active_outbound_item *aob;
  nghttp2_bufs *framebufs;
  nghttp2_mem *mem;

  mem = &session->mem;
  aob = &session->aob;
  framebufs = &aob->framebufs;

  /* We may have idle streams more than we expect (e.g.,
     nghttp2_session_change_stream_priority() or
     nghttp2_session_create_idle_stream()).  Adjust them here. */
  rv = nghttp2_session_adjust_idle_stream(session);
  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  for (;;) {
    switch (aob->state) {
    case NGHTTP2_OB_POP_ITEM: {
      nghttp2_outbound_item *item;

      item = nghttp2_session_pop_next_ob_item(session);
      if (item == NULL) {
        return 0;
      }

      rv = session_prep_frame(session, item);
      if (rv == NGHTTP2_ERR_PAUSE) {
        return 0;
      }
      if (rv == NGHTTP2_ERR_DEFERRED) {
        DEBUGF("send: frame transmission deferred\n");
        break;
      }
      if (rv < 0) {
        int32_t opened_stream_id = 0;
        uint32_t error_code = NGHTTP2_INTERNAL_ERROR;
        int rv2 = 0;

        DEBUGF("send: frame preparation failed with %s\n",
               nghttp2_strerror(rv));
        /* TODO If the error comes from compressor, the connection
           must be closed. */
        if (item->frame.hd.type != NGHTTP2_DATA &&
            session->callbacks.on_frame_not_send_callback && is_non_fatal(rv)) {
          nghttp2_frame *frame = &item->frame;
          /* The library is responsible for the transmission of
             WINDOW_UPDATE frame, so we don't call error callback for
             it. */
          if (frame->hd.type != NGHTTP2_WINDOW_UPDATE &&
              session->callbacks.on_frame_not_send_callback(
                session, frame, rv, session->user_data) != 0) {
            nghttp2_outbound_item_free(item, mem);
            nghttp2_mem_free(mem, item);

            return NGHTTP2_ERR_CALLBACK_FAILURE;
          }
        }
        /* We have to close stream opened by failed request HEADERS
           or PUSH_PROMISE. */
        switch (item->frame.hd.type) {
        case NGHTTP2_HEADERS:
          if (item->frame.headers.cat == NGHTTP2_HCAT_REQUEST) {
            opened_stream_id = item->frame.hd.stream_id;
            if (item->aux_data.headers.canceled) {
              error_code = item->aux_data.headers.error_code;
            } else {
              /* Set error_code to REFUSED_STREAM so that application
                 can send request again. */
              error_code = NGHTTP2_REFUSED_STREAM;
            }
          }
          break;
        case NGHTTP2_PUSH_PROMISE:
          opened_stream_id = item->frame.push_promise.promised_stream_id;
          break;
        }
        if (opened_stream_id) {
          /* careful not to override rv */
          rv2 =
            nghttp2_session_close_stream(session, opened_stream_id, error_code);
        }

        nghttp2_outbound_item_free(item, mem);
        nghttp2_mem_free(mem, item);
        active_outbound_item_reset(aob, mem);

        if (nghttp2_is_fatal(rv2)) {
          return rv2;
        }

        if (rv == NGHTTP2_ERR_HEADER_COMP) {
          /* If header compression error occurred, should terminate
             connection. */
          rv =
            nghttp2_session_terminate_session(session, NGHTTP2_INTERNAL_ERROR);
        }
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }
        break;
      }

      aob->item = item;

      nghttp2_bufs_rewind(framebufs);

      if (item->frame.hd.type != NGHTTP2_DATA) {
        nghttp2_frame *frame;

        frame = &item->frame;

        DEBUGF("send: next frame: payloadlen=%zu, type=%u, flags=0x%02x, "
               "stream_id=%d\n",
               frame->hd.length, frame->hd.type, frame->hd.flags,
               frame->hd.stream_id);

        rv = session_call_before_frame_send(session, frame);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }

        if (rv == NGHTTP2_ERR_CANCEL) {
          int32_t opened_stream_id = 0;
          uint32_t error_code = NGHTTP2_INTERNAL_ERROR;

          if (session->callbacks.on_frame_not_send_callback) {
            if (session->callbacks.on_frame_not_send_callback(
                  session, frame, rv, session->user_data) != 0) {
              return NGHTTP2_ERR_CALLBACK_FAILURE;
            }
          }

          /* We have to close stream opened by canceled request
             HEADERS or PUSH_PROMISE. */
          switch (item->frame.hd.type) {
          case NGHTTP2_HEADERS:
            if (item->frame.headers.cat == NGHTTP2_HCAT_REQUEST) {
              opened_stream_id = item->frame.hd.stream_id;
              /* We don't have to check
                 item->aux_data.headers.canceled since it has already
                 been checked. */
              /* Set error_code to REFUSED_STREAM so that application
                 can send request again. */
              error_code = NGHTTP2_REFUSED_STREAM;
            }
            break;
          case NGHTTP2_PUSH_PROMISE:
            opened_stream_id = item->frame.push_promise.promised_stream_id;
            break;
          }
          if (opened_stream_id) {
            /* careful not to override rv */
            int rv2;
            rv2 = nghttp2_session_close_stream(session, opened_stream_id,
                                               error_code);

            if (nghttp2_is_fatal(rv2)) {
              return rv2;
            }
          }

          active_outbound_item_reset(aob, mem);

          break;
        }
      } else {
        DEBUGF("send: next frame: DATA\n");

        if (item->aux_data.data.no_copy) {
          aob->state = NGHTTP2_OB_SEND_NO_COPY;
          break;
        }
      }

      DEBUGF("send: start transmitting frame type=%u, length=%td\n",
             framebufs->cur->buf.pos[3],
             framebufs->cur->buf.last - framebufs->cur->buf.pos);

      aob->state = NGHTTP2_OB_SEND_DATA;

      break;
    }
    case NGHTTP2_OB_SEND_DATA: {
      size_t datalen;
      nghttp2_buf *buf;

      buf = &framebufs->cur->buf;

      if (buf->pos == buf->last) {
        DEBUGF("send: end transmission of a frame\n");

        /* Frame has completely sent */
        if (fast_cb) {
          session_after_frame_sent2(session);
        } else {
          rv = session_after_frame_sent1(session);
          if (rv < 0) {
            /* FATAL */
            assert(nghttp2_is_fatal(rv));
            return rv;
          }
          session_after_frame_sent2(session);
        }
        /* We have already adjusted the next state */
        break;
      }

      *data_ptr = buf->pos;
      datalen = nghttp2_buf_len(buf);

      /* We increment the offset here. If send_callback does not send
         everything, we will adjust it. */
      buf->pos += datalen;

      return (nghttp2_ssize)datalen;
    }
    case NGHTTP2_OB_SEND_NO_COPY: {
      nghttp2_stream *stream;
      nghttp2_frame *frame;
      int pause;

      DEBUGF("send: no copy DATA\n");

      frame = &aob->item->frame;

      stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
      if (stream == NULL) {
        DEBUGF("send: no copy DATA cancelled because stream was closed\n");

        active_outbound_item_reset(aob, mem);

        break;
      }

      rv = session_call_send_data(session, aob->item, framebufs);
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }

      if (rv == NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE) {
        session_detach_stream_item(session, stream);

        rv = nghttp2_session_add_rst_stream(session, frame->hd.stream_id,
                                            NGHTTP2_INTERNAL_ERROR);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }

        active_outbound_item_reset(aob, mem);

        break;
      }

      if (rv == NGHTTP2_ERR_WOULDBLOCK) {
        return 0;
      }

      pause = (rv == NGHTTP2_ERR_PAUSE);

      rv = session_after_frame_sent1(session);
      if (rv < 0) {
        assert(nghttp2_is_fatal(rv));
        return rv;
      }
      session_after_frame_sent2(session);

      /* We have already adjusted the next state */

      if (pause) {
        return 0;
      }

      break;
    }
    case NGHTTP2_OB_SEND_CLIENT_MAGIC: {
      size_t datalen;
      nghttp2_buf *buf;

      buf = &framebufs->cur->buf;

      if (buf->pos == buf->last) {
        DEBUGF("send: end transmission of client magic\n");
        active_outbound_item_reset(aob, mem);
        break;
      }

      *data_ptr = buf->pos;
      datalen = nghttp2_buf_len(buf);

      buf->pos += datalen;

      return (nghttp2_ssize)datalen;
    }
    }
  }
}